

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O0

void __thiscall OpenMD::OpenMDBitSet::OpenMDBitSet(OpenMDBitSet *this,size_t nbits)

{
  size_type in_RSI;
  allocator_type *in_RDI;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  this_00 = (vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffffef;
  std::allocator<bool>::allocator((allocator<bool> *)0x1a27e5);
  std::vector<bool,_std::allocator<bool>_>::vector(this_00,in_RSI,in_RDI);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1a2805);
  clearAll((OpenMDBitSet *)in_RDI);
  return;
}

Assistant:

OpenMDBitSet(size_t nbits) : bitset_(nbits) { clearAll(); }